

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall
Instance::Instance(Instance *this,Graph *g,vector<Train,_std::allocator<Train>_> *trains,
                  uint32_t maxTimeSteps,context *c)

{
  ostream *poVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  clock_t cVar5;
  clock_t cVar6;
  uint in_ECX;
  vector<Train,_std::allocator<Train>_> *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  allocator_type *in_R8;
  clock_t c_end;
  clock_t c_start;
  stringstream oVarName;
  size_t edge;
  size_t time;
  size_t train;
  EdgeSet reachable;
  stringstream bVarName;
  int i;
  context *in_stack_fffffffffffffaa8;
  optimize *in_stack_fffffffffffffab0;
  allocator_type *in_stack_fffffffffffffab8;
  ast_vector_tpl<z3::expr> *in_stack_fffffffffffffac0;
  size_type in_stack_fffffffffffffac8;
  vector<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>,_std::allocator<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>_>
  *in_stack_fffffffffffffad0;
  Graph *in_stack_fffffffffffffae8;
  ulong uVar7;
  Instance *in_stack_fffffffffffffaf0;
  context *in_stack_fffffffffffffaf8;
  Edge *this_00;
  vector<Train,_std::allocator<Train>_> *in_stack_fffffffffffffb00;
  string local_450 [24];
  Edge *in_stack_fffffffffffffbc8;
  Edge *in_stack_fffffffffffffbd0;
  Graph *in_stack_fffffffffffffbd8;
  stringstream local_420 [16];
  ostream local_410 [376];
  ulong local_298;
  ulong local_280;
  ulong local_260;
  string local_220 [48];
  stringstream local_1f0 [16];
  ostream local_1e0 [376];
  int local_68;
  allocator_type *local_28;
  uint local_1c;
  
  *in_RDI = &PTR_enforceConstraints_0013bc60;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  local_28 = in_R8;
  local_1c = in_ECX;
  Graph::Graph((Graph *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  std::vector<Train,_std::allocator<Train>_>::vector
            (in_stack_fffffffffffffb00,
             (vector<Train,_std::allocator<Train>_> *)in_stack_fffffffffffffaf8);
  *(uint *)(in_RDI + 0x27) = local_1c;
  in_RDI[0x28] = local_28;
  z3::optimize::optimize(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  std::vector<Train,_std::allocator<Train>_>::size(in_RDX);
  z3::ast_vector_tpl<z3::expr>::ast_vector_tpl
            ((ast_vector_tpl<z3::expr> *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  std::allocator<z3::ast_vector_tpl<z3::expr>_>::allocator
            ((allocator<z3::ast_vector_tpl<z3::expr>_> *)0x1039f7);
  std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>::vector
            ((vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_> *
             )in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
             (allocator_type *)in_stack_fffffffffffffab8);
  std::
  allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>
  ::allocator((allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>
               *)0x103a33);
  std::
  vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
  ::vector((vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
            *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
           (value_type *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  std::
  allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>
  ::~allocator((allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>
                *)0x103a67);
  std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>::~vector
            ((vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_> *
             )in_stack_fffffffffffffac0);
  std::allocator<z3::ast_vector_tpl<z3::expr>_>::~allocator
            ((allocator<z3::ast_vector_tpl<z3::expr>_> *)0x103a81);
  z3::ast_vector_tpl<z3::expr>::~ast_vector_tpl
            ((ast_vector_tpl<z3::expr> *)in_stack_fffffffffffffab0);
  z3::ast_vector_tpl<z3::expr>::ast_vector_tpl
            ((ast_vector_tpl<z3::expr> *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  std::vector<Train,_std::allocator<Train>_>::size(in_RDX);
  std::
  allocator<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>
  ::allocator((allocator<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>
               *)0x103af4);
  std::
  vector<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>,_std::allocator<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>_>
  ::vector(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
           (allocator_type *)in_stack_fffffffffffffac0);
  std::
  allocator<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>
  ::~allocator((allocator<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>
                *)0x103b20);
  std::vector<z3::expr,_std::allocator<z3::expr>_>::vector
            ((vector<z3::expr,_std::allocator<z3::expr>_> *)0x103b39);
  for (local_68 = 0; local_68 < *(int *)(in_RSI + 0xb0); local_68 = local_68 + 1) {
    std::__cxx11::stringstream::stringstream(local_1f0);
    poVar1 = std::operator<<(local_1e0,"border_");
    std::ostream::operator<<(poVar1,local_68);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    z3::context::bool_const(in_stack_fffffffffffffaf8,(char *)in_stack_fffffffffffffaf0);
    z3::ast_vector_tpl<z3::expr>::push_back
              (in_stack_fffffffffffffac0,(expr *)in_stack_fffffffffffffab8);
    z3::expr::~expr((expr *)0x103c18);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::stringstream::~stringstream(local_1f0);
  }
  std::
  unordered_set<const_Edge_*,_std::hash<const_Edge_*>,_std::equal_to<const_Edge_*>,_std::allocator<const_Edge_*>_>
  ::unordered_set((unordered_set<const_Edge_*,_std::hash<const_Edge_*>,_std::equal_to<const_Edge_*>,_std::allocator<const_Edge_*>_>
                   *)0x103dc7);
  local_260 = 0;
  while( true ) {
    uVar7 = local_260;
    sVar2 = std::vector<Train,_std::allocator<Train>_>::size(in_RDX);
    if (sVar2 <= uVar7) break;
    in_stack_fffffffffffffaf0 = (Instance *)(in_RDI + 3);
    pvVar3 = std::vector<Train,_std::allocator<Train>_>::operator[](in_RDX,local_260);
    this_00 = (pvVar3->start).stopEdge;
    std::vector<Train,_std::allocator<Train>_>::operator[](in_RDX,local_260);
    std::vector<Stop,_std::allocator<Stop>_>::back
              ((vector<Stop,_std::allocator<Stop>_> *)in_stack_fffffffffffffab0);
    Graph::paths(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    std::
    vector<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>,_std::allocator<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>_>
    ::operator[]((vector<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>,_std::allocator<std::vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>_>_>
                  *)(in_RDI + 0x30),local_260);
    std::
    vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
    ::operator=((vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
                 *)in_stack_fffffffffffffac0,
                (vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
                 *)in_stack_fffffffffffffab8);
    std::
    vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
    ::~vector((vector<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>,_std::allocator<std::vector<const_Edge_*,_std::allocator<const_Edge_*>_>_>_>
               *)in_stack_fffffffffffffac0);
    pvVar3 = std::vector<Train,_std::allocator<Train>_>::operator[](in_RDX,local_260);
    for (local_280 = (ulong)(pvVar3->start).arrivalTime; local_280 < local_1c;
        local_280 = local_280 + 1) {
      z3::ast_vector_tpl<z3::expr>::ast_vector_tpl
                ((ast_vector_tpl<z3::expr> *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
      pvVar4 = std::
               vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
               ::operator[]((vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                             *)(in_RDI + 0x2b),local_260);
      std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>::
      operator[](pvVar4,local_280);
      z3::ast_vector_tpl<z3::expr>::operator=
                ((ast_vector_tpl<z3::expr> *)in_stack_fffffffffffffab0,
                 (ast_vector_tpl<z3::expr> *)in_stack_fffffffffffffaa8);
      z3::ast_vector_tpl<z3::expr>::~ast_vector_tpl
                ((ast_vector_tpl<z3::expr> *)in_stack_fffffffffffffab0);
      local_298 = 0;
      while( true ) {
        uVar7 = local_298;
        sVar2 = std::vector<Edge_*,_std::allocator<Edge_*>_>::size
                          ((vector<Edge_*,_std::allocator<Edge_*>_> *)(in_RDI + 0x21));
        if (sVar2 <= uVar7) break;
        std::__cxx11::stringstream::stringstream(local_420);
        poVar1 = std::operator<<(local_410,"occupies_");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_260);
        poVar1 = std::operator<<(poVar1,"_");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_280);
        in_stack_fffffffffffffac0 = (ast_vector_tpl<z3::expr> *)std::operator<<(poVar1,"_");
        std::ostream::operator<<((ostream *)in_stack_fffffffffffffac0,local_298);
        pvVar4 = std::
                 vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                 ::operator[]((vector<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                               *)(in_RDI + 0x2b),local_260);
        in_stack_fffffffffffffab0 =
             (optimize *)
             std::
             vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>::
             operator[](pvVar4,local_280);
        in_stack_fffffffffffffab8 = local_28;
        std::__cxx11::stringstream::str();
        std::__cxx11::string::c_str();
        z3::context::bool_const((context *)this_00,(char *)in_stack_fffffffffffffaf0);
        z3::ast_vector_tpl<z3::expr>::push_back
                  (in_stack_fffffffffffffac0,(expr *)in_stack_fffffffffffffab8);
        z3::expr::~expr((expr *)0x1040ba);
        std::__cxx11::string::~string(local_450);
        std::__cxx11::stringstream::~stringstream(local_420);
        local_298 = local_298 + 1;
      }
    }
    local_260 = local_260 + 1;
  }
  cVar5 = clock();
  computeConstraints(in_stack_fffffffffffffaf0);
  cVar6 = clock();
  in_RDI[1] = ((double)(cVar6 - cVar5) * 1000.0) / 1000000.0 + (double)in_RDI[1];
  std::
  unordered_set<const_Edge_*,_std::hash<const_Edge_*>,_std::equal_to<const_Edge_*>,_std::allocator<const_Edge_*>_>
  ::~unordered_set((unordered_set<const_Edge_*,_std::hash<const_Edge_*>,_std::equal_to<const_Edge_*>,_std::allocator<const_Edge_*>_>
                    *)0x104246);
  return;
}

Assistant:

Instance::Instance(Graph g, std::vector<Train> trains, uint32_t maxTimeSteps,
                   context *c)
    : graph(g), trains(trains), maxTimeSteps(maxTimeSteps), c(c), solver(*c),
      occupiedVars(trains.size(), std::vector<expr_vector>(maxTimeSteps, *c)),
      borderVars(*c), trainPaths(trains.size()) {
  // init boundary variables
  for (int i = 0; i < g.vertexCount; i++) {
    std::stringstream bVarName;
    bVarName << "border_" << i;
    borderVars.push_back(c->bool_const(bVarName.str().c_str()));
  }

  EdgeSet reachable;
  // init occupied variables and train paths
  for (size_t train = 0; train < trains.size(); train++) {
    trainPaths[train] = graph.paths(trains[train].start.stopEdge,
                                    trains[train].stops.back().stopEdge);
    for (size_t time = trains[train].start.arrivalTime; time < maxTimeSteps;
         time++) {
      occupiedVars[train][time] = expr_vector(*c);
      for (size_t edge = 0; edge < graph.edges.size(); edge++) {
        std::stringstream oVarName;
        oVarName << "occupies_" << train << "_" << time << "_" << edge;
        occupiedVars[train][time].push_back(
            c->bool_const(oVarName.str().c_str()));
      }
    }
  }
  std::clock_t c_start = std::clock();
  computeConstraints();
  std::clock_t c_end = std::clock();
  constraint_t += 1000.0 * (c_end - c_start) / CLOCKS_PER_SEC;
}